

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O3

void __thiscall
Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::RenderDeviceBase
          (RenderDeviceBase<Diligent::EngineVkImplTraits> *this,IReferenceCounters *pRefCounters,
          IMemoryAllocator *RawMemAllocator,IEngineFactory *pEngineFactory,
          EngineCreateInfo *EngineCI,GraphicsAdapterInfo *AdapterInfo)

{
  _Vector_impl_data *p_Var1;
  Bool *pBVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  int iVar5;
  undefined4 extraout_var;
  TextureFormatAttribs *pTVar7;
  long lVar8;
  Uint32 Fmt;
  long lVar9;
  value_type local_128;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_110;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_108;
  RefCntAutoPtr<Diligent::IThreadPool> *local_100;
  FixedBlockMemoryAllocator *local_f8;
  FixedBlockMemoryAllocator *local_f0;
  FixedBlockMemoryAllocator *local_e8;
  FixedBlockMemoryAllocator *local_e0;
  FixedBlockMemoryAllocator *local_d8;
  FixedBlockMemoryAllocator *local_d0;
  FixedBlockMemoryAllocator *local_c8;
  vector<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
  *local_c0;
  FixedBlockMemoryAllocator *local_b8;
  FixedBlockMemoryAllocator *local_b0;
  FixedBlockMemoryAllocator *local_a8;
  FixedBlockMemoryAllocator *local_a0;
  FixedBlockMemoryAllocator *local_98;
  FixedBlockMemoryAllocator *local_90;
  FixedBlockMemoryAllocator *local_88;
  FixedBlockMemoryAllocator *local_80;
  FixedBlockMemoryAllocator *local_78;
  FixedBlockMemoryAllocator *local_70;
  vector<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
  *local_68;
  vector<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
  *local_60;
  vector<bool,_Diligent::STDAllocator<bool,_Diligent::IMemoryAllocator>_> *local_58;
  allocator_type local_50;
  pointer pvVar6;
  
  RefCountedObject<Diligent::IRenderDeviceVk>::RefCountedObject<>
            ((RefCountedObject<Diligent::IRenderDeviceVk> *)this,pRefCounters);
  (this->super_ObjectBase<Diligent::IRenderDeviceVk>).
  super_RefCountedObject<Diligent::IRenderDeviceVk>.super_IRenderDeviceVk.super_IRenderDevice.
  super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_00aecee0;
  (this->m_pEngineFactory).m_pObject = pEngineFactory;
  if (pEngineFactory != (IEngineFactory *)0x0) {
    (**(code **)(*(long *)pEngineFactory + 8))(pEngineFactory);
  }
  this->m_ValidationFlags = EngineCI->ValidationFlags;
  memcpy(&this->m_AdapterInfo,AdapterInfo,0x338);
  (this->m_DeviceInfo).Type = RENDER_DEVICE_TYPE_UNDEFINED;
  (this->m_DeviceInfo).APIVersion.Major = 0;
  *(undefined8 *)&(this->m_DeviceInfo).APIVersion.Minor = 0;
  (this->m_DeviceInfo).Features.ComputeShaders = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.GeometryShaders = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.Tessellation = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.MeshShaders = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.RayTracing = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.BindlessResources = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.OcclusionQueries = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.BinaryOcclusionQueries = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.TimestampQueries = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.PipelineStatisticsQueries = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.DurationQueries = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.DepthBiasClamp = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.DepthClamp = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.IndependentBlend = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.DualSourceBlend = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.MultiViewport = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.TextureCompressionBC = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.TextureCompressionETC2 = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.VertexPipelineUAVWritesAndAtomics = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.PixelUAVWritesAndAtomics = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.TextureUAVExtendedFormats = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.ShaderFloat16 = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.ResourceBuffer16BitAccess = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.UniformBuffer16BitAccess = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.ShaderInputOutput16 = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.ShaderInt8 = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.ResourceBuffer8BitAccess = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.UniformBuffer8BitAccess = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.ShaderResourceStaticArrays = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.ShaderResourceRuntimeArrays = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.WaveOp = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.InstanceDataStepRate = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.UniformBuffer8BitAccess = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.ShaderResourceStaticArrays = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.ShaderResourceRuntimeArrays = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.WaveOp = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.InstanceDataStepRate = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.NativeFence = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.TileShaders = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.TransferQueueTimestampQueries = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.VariableRateShading = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.SparseResources = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.SubpassFramebufferFetch = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.TextureComponentSwizzle = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.TextureSubresourceViews = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.NativeMultiDraw = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.AsyncShaderCompilation = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).Features.FormattedBuffers = DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DeviceInfo).NDC.MinZ = 0.0;
  (this->m_DeviceInfo).NDC.ZtoDepthScale = 0.0;
  *(undefined8 *)&(this->m_DeviceInfo).NDC.YtoVScale = 0;
  *(undefined8 *)&(this->m_DeviceInfo).MaxShaderVersion.HLSL.Minor = 0;
  *(undefined8 *)&(this->m_DeviceInfo).MaxShaderVersion.GLSL.Minor = 0;
  (this->m_DeviceInfo).MaxShaderVersion.GLESSL.Major = 0;
  (this->m_DeviceInfo).MaxShaderVersion.GLESSL.Minor = 0;
  (this->m_DeviceInfo).MaxShaderVersion.MSL.Major = 0;
  (this->m_DeviceInfo).MaxShaderVersion.MSL.Minor = 0;
  (this->m_SamplersRegistry).m_NumRequestsToPurge = 0x400;
  *(undefined8 *)&(this->m_SamplersRegistry).m_NumRequestsSinceLastPurge = 0;
  *(undefined8 *)((long)&(this->m_SamplersRegistry).m_CacheMtx.super___mutex_base._M_mutex + 4) = 0;
  *(undefined8 *)((long)&(this->m_SamplersRegistry).m_CacheMtx.super___mutex_base._M_mutex + 0xc) =
       0;
  *(undefined8 *)((long)&(this->m_SamplersRegistry).m_CacheMtx.super___mutex_base._M_mutex + 0x14) =
       0;
  (this->m_SamplersRegistry).m_CacheMtx.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_SamplersRegistry).m_CacheMtx.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_SamplersRegistry).m_Cache._M_h._M_buckets =
       &(this->m_SamplersRegistry).m_Cache._M_h._M_single_bucket;
  (this->m_SamplersRegistry).m_Cache._M_h._M_bucket_count = 1;
  (this->m_SamplersRegistry).m_Cache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_SamplersRegistry).m_Cache._M_h._M_element_count = 0;
  (this->m_SamplersRegistry).m_Cache._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_SamplersRegistry).m_Cache._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_SamplersRegistry).m_Cache._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_TextureFormatsInfo).
  super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Tp_alloc_type.m_Allocator = RawMemAllocator;
  (this->m_TextureFormatsInfo).
  super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Tp_alloc_type.m_dvpDescription = "Allocator for vector<TextureFormatInfoExt>";
  (this->m_TextureFormatsInfo).
  super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Tp_alloc_type.m_dvpFileName =
       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
  ;
  (this->m_TextureFormatsInfo).
  super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Tp_alloc_type.m_dvpLineNumber = 0x8d;
  (this->m_TextureFormatsInfo).
  super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_TextureFormatsInfo).
  super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_TextureFormatsInfo).
  super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = (*RawMemAllocator->_vptr_IMemoryAllocator[2])
                    (RawMemAllocator,0x1090,8,"Allocator for vector<TextureFormatInfoExt>",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
                     ,0x8d);
  pvVar6 = (pointer)CONCAT44(extraout_var,iVar5);
  local_c0 = &this->m_TextureFormatsInfo;
  p_Var1 = &(this->m_TextureFormatsInfo).
            super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
            ._M_impl.super__Vector_impl_data;
  (this->m_TextureFormatsInfo).
  super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Vector_impl_data._M_start = pvVar6;
  (this->m_TextureFormatsInfo).
  super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar6;
  (this->m_TextureFormatsInfo).
  super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar6 + 0x6a;
  lVar8 = 0;
  do {
    *(char **)((pvVar6->super_TextureFormatInfo).Padding + lVar8 + -0x11) = "TEX_FORMAT_UNKNOWN";
    pBVar2 = (pvVar6->super_TextureFormatInfo).Padding + lVar8 + -9;
    *(undefined8 *)pBVar2 = 0;
    *(undefined8 *)(pBVar2 + 8) = 0;
    puVar3 = (undefined8 *)((long)(&pvVar6->super_TextureFormatInfo + 1) + lVar8);
    *puVar3 = 0;
    puVar3[1] = 0;
    lVar8 = lVar8 + 0x28;
  } while (lVar8 != 0x1090);
  (this->m_TextureFormatsInfo).
  super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar6 + 0x6a;
  local_128.m_pRefCounters =
       (RefCountersImpl *)((ulong)local_128.m_pRefCounters & 0xffffffffffffff00);
  local_50.m_dvpDescription = "Allocator for vector<bool>";
  local_50.m_dvpFileName =
       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
  ;
  local_50.m_dvpLineNumber = 0x8e;
  local_50.m_Allocator = RawMemAllocator;
  std::vector<bool,_Diligent::STDAllocator<bool,_Diligent::IMemoryAllocator>_>::vector
            (&this->m_TexFmtInfoInitFlags,0x6a,(bool *)&local_128,&local_50);
  local_60 = &this->m_wpImmediateContexts;
  local_128.m_pRefCounters = (RefCountersImpl *)0x0;
  local_128.m_pObject = (DeviceContextVkImpl *)0x0;
  local_50.m_dvpDescription = "Allocator for vector<RefCntWeakPtr<DeviceContextImplType>>";
  local_50.m_dvpFileName =
       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
  ;
  local_50.m_dvpLineNumber = 0x8f;
  local_58 = &this->m_TexFmtInfoInitFlags;
  local_50.m_Allocator = RawMemAllocator;
  std::
  vector<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
  ::vector(local_60,(ulong)(EngineCI->NumImmediateContexts +
                           (uint)(EngineCI->NumImmediateContexts == 0)),&local_128,
           (allocator_type *)&local_50);
  RefCntWeakPtr<Diligent::DeviceContextVkImpl>::Release(&local_128);
  *(undefined8 *)((long)&(this->m_DeferredCtxMtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_DeferredCtxMtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_DeferredCtxMtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_DeferredCtxMtx).super___mutex_base._M_mutex + 8) = 0;
  (this->m_DeferredCtxMtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_68 = &this->m_wpDeferredContexts;
  local_128.m_pRefCounters = (RefCountersImpl *)0x0;
  local_128.m_pObject = (DeviceContextVkImpl *)0x0;
  local_50.m_dvpDescription = "Allocator for vector<RefCntWeakPtr<DeviceContextImplType>>";
  local_50.m_dvpFileName =
       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
  ;
  local_50.m_dvpLineNumber = 0x90;
  local_50.m_Allocator = RawMemAllocator;
  std::
  vector<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
  ::vector(local_68,(ulong)EngineCI->NumDeferredContexts,&local_128,(allocator_type *)&local_50);
  RefCntWeakPtr<Diligent::DeviceContextVkImpl>::Release(&local_128);
  this->m_RawMemAllocator = RawMemAllocator;
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
            (&this->m_TexObjAllocator,RawMemAllocator,0xf0,0x10);
  local_70 = &this->m_TexObjAllocator;
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
            (&this->m_TexViewObjAllocator,RawMemAllocator,0x80,0x20);
  local_78 = &this->m_TexViewObjAllocator;
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
            (&this->m_BufObjAllocator,RawMemAllocator,200,0x10);
  local_88 = &this->m_BuffViewObjAllocator;
  local_80 = &this->m_BufObjAllocator;
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator(local_88,RawMemAllocator,0x70,0x20);
  local_90 = &this->m_ShaderObjAllocator;
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator(local_90,RawMemAllocator,0xb8,0x10);
  local_98 = &this->m_SamplerObjAllocator;
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator(local_98,RawMemAllocator,0x78,0x20);
  local_a0 = &this->m_PSOAllocator;
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator(local_a0,RawMemAllocator,0x108,0x10);
  local_a8 = &this->m_SRBAllocator;
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator(local_a8,RawMemAllocator,0x68,0x40);
  local_b0 = &this->m_ResMappingAllocator;
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator(local_b0,RawMemAllocator,0x70,8);
  local_b8 = &this->m_FenceAllocator;
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator(local_b8,RawMemAllocator,0xe0,0x10);
  local_c8 = &this->m_QueryAllocator;
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator(local_c8,RawMemAllocator,0x60,0x10);
  local_d0 = &this->m_RenderPassAllocator;
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator(local_d0,RawMemAllocator,0xa0,0x10);
  local_d8 = &this->m_FramebufferAllocator;
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator(local_d8,RawMemAllocator,0x80,0x10);
  local_e0 = &this->m_BLASAllocator;
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator(local_e0,RawMemAllocator,0x120,8);
  local_e8 = &this->m_TLASAllocator;
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator(local_e8,RawMemAllocator,0x128,8);
  local_f0 = &this->m_SBTAllocator;
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator(local_f0,RawMemAllocator,0x130,8);
  local_f8 = &this->m_PipeResSignAllocator;
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator(local_f8,RawMemAllocator,0x118,0x10);
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
            (&this->m_MemObjAllocator,RawMemAllocator,0x68,0x10);
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
            (&this->m_PSOCacheAllocator,RawMemAllocator,0x50,4);
  local_100 = &this->m_pShaderCompilationThreadPool;
  local_108 = &this->m_RecycledDynamicBufferIds;
  (this->m_RecycledDynamicBufferIds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_RecycledDynamicBufferIds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_RecycledDynamicBufferIds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_110 = &this->m_DbgRecycledDynamicBufferIds;
  (this->m_pShaderCompilationThreadPool).m_pObject = (IThreadPool *)0x0;
  this->m_UniqueId = (__atomic_base<int>)0x0;
  this->m_NextDynamicBufferId = (__atomic_base<unsigned_int>)0x0;
  (this->m_RecycledDynamicBufferIdsLock).m_IsLocked._M_base._M_i = false;
  (this->m_DbgRecycledDynamicBufferIds)._M_h._M_buckets =
       &(this->m_DbgRecycledDynamicBufferIds)._M_h._M_single_bucket;
  (this->m_DbgRecycledDynamicBufferIds)._M_h._M_bucket_count = 1;
  (this->m_DbgRecycledDynamicBufferIds)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_DbgRecycledDynamicBufferIds)._M_h._M_element_count = 0;
  (this->m_DbgRecycledDynamicBufferIds)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_DbgRecycledDynamicBufferIds)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_DbgRecycledDynamicBufferIds)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  lVar8 = 0;
  lVar9 = 0;
  do {
    pTVar7 = GetTextureFormatAttribs((TEXTURE_FORMAT)lVar9);
    uVar4 = *(undefined8 *)&pTVar7->Format;
    pBVar2 = (p_Var1->_M_start->super_TextureFormatInfo).Padding + lVar8 + -0x11;
    *(Char **)pBVar2 = pTVar7->Name;
    *(undefined8 *)(pBVar2 + 8) = uVar4;
    lVar9 = lVar9 + 1;
    lVar8 = lVar8 + 0x28;
  } while (lVar9 != 0x6a);
  pvVar6 = p_Var1->_M_start;
  lVar8 = 0;
  do {
    pvVar6[*(ushort *)((long)&DAT_007fb9f0 + lVar8)].Filterable = true;
    lVar8 = lVar8 + 2;
  } while (lVar8 != 0x4a);
  return;
}

Assistant:

RenderDeviceBase(IReferenceCounters*        pRefCounters,
                     IMemoryAllocator&          RawMemAllocator,
                     IEngineFactory*            pEngineFactory,
                     const EngineCreateInfo&    EngineCI,
                     const GraphicsAdapterInfo& AdapterInfo) :
        // clang-format off
        TObjectBase           {pRefCounters},
        m_pEngineFactory      {pEngineFactory},
        m_ValidationFlags     {EngineCI.ValidationFlags},
        m_AdapterInfo         {AdapterInfo},
        m_TextureFormatsInfo  (TEX_FORMAT_NUM_FORMATS, TextureFormatInfoExt(), STD_ALLOCATOR_RAW_MEM(TextureFormatInfoExt, RawMemAllocator, "Allocator for vector<TextureFormatInfoExt>")),
        m_TexFmtInfoInitFlags (TEX_FORMAT_NUM_FORMATS, false, STD_ALLOCATOR_RAW_MEM(bool, RawMemAllocator, "Allocator for vector<bool>")),
        m_wpImmediateContexts ((std::max)(1u, EngineCI.NumImmediateContexts), RefCntWeakPtr<DeviceContextImplType>(), STD_ALLOCATOR_RAW_MEM(RefCntWeakPtr<DeviceContextImplType>, RawMemAllocator, "Allocator for vector<RefCntWeakPtr<DeviceContextImplType>>")),
        m_wpDeferredContexts  (EngineCI.NumDeferredContexts, RefCntWeakPtr<DeviceContextImplType>(), STD_ALLOCATOR_RAW_MEM(RefCntWeakPtr<DeviceContextImplType>, RawMemAllocator, "Allocator for vector<RefCntWeakPtr<DeviceContextImplType>>")),
        m_RawMemAllocator     {RawMemAllocator},
        m_TexObjAllocator     {RawMemAllocator, sizeof(TextureImplType),                   16},
        m_TexViewObjAllocator {RawMemAllocator, sizeof(TextureViewImplType),               32},
        m_BufObjAllocator     {RawMemAllocator, sizeof(BufferImplType),                    16},
        m_BuffViewObjAllocator{RawMemAllocator, sizeof(BufferViewImplType),                32},
        m_ShaderObjAllocator  {RawMemAllocator, sizeof(ShaderImplType),                    16},
        m_SamplerObjAllocator {RawMemAllocator, sizeof(SamplerImplType),                   32},
        m_PSOAllocator        {RawMemAllocator, sizeof(PipelineStateImplType),             16},
        m_SRBAllocator        {RawMemAllocator, sizeof(ShaderResourceBindingImplType),     64},
        m_ResMappingAllocator {RawMemAllocator, sizeof(ResourceMappingImpl),                8},
        m_FenceAllocator      {RawMemAllocator, sizeof(FenceImplType),                     16},
        m_QueryAllocator      {RawMemAllocator, sizeof(QueryImplType),                     16},
        m_RenderPassAllocator {RawMemAllocator, sizeof(RenderPassImplType),                16},
        m_FramebufferAllocator{RawMemAllocator, sizeof(FramebufferImplType),               16},
        m_BLASAllocator       {RawMemAllocator, sizeof(BottomLevelASImplType),              8},
        m_TLASAllocator       {RawMemAllocator, sizeof(TopLevelASImplType),                 8},
        m_SBTAllocator        {RawMemAllocator, sizeof(ShaderBindingTableImplType),         8},
        m_PipeResSignAllocator{RawMemAllocator, sizeof(PipelineResourceSignatureImplType), 16},
        m_MemObjAllocator     {RawMemAllocator, sizeof(DeviceMemoryImplType),              16},
        m_PSOCacheAllocator   {RawMemAllocator, sizeof(PipelineStateCacheImplType),         4}
    // clang-format on
    {
        // Initialize texture format info
        for (Uint32 Fmt = TEX_FORMAT_UNKNOWN; Fmt < TEX_FORMAT_NUM_FORMATS; ++Fmt)
            static_cast<TextureFormatAttribs&>(m_TextureFormatsInfo[Fmt]) = GetTextureFormatAttribs(static_cast<TEXTURE_FORMAT>(Fmt));

        // https://msdn.microsoft.com/en-us/library/windows/desktop/ff471325(v=vs.85).aspx
        TEXTURE_FORMAT FilterableFormats[] =
            {
                TEX_FORMAT_RGBA32_FLOAT, // OpenGL ES3.1 does not require this format to be filterable
                TEX_FORMAT_RGBA16_FLOAT,
                TEX_FORMAT_RGBA16_UNORM,
                TEX_FORMAT_RGBA16_SNORM,
                TEX_FORMAT_RG32_FLOAT, // OpenGL ES3.1 does not require this format to be filterable
                TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS,
                //TEX_FORMAT_R10G10B10A2_UNORM,
                TEX_FORMAT_R11G11B10_FLOAT,
                TEX_FORMAT_RGBA8_UNORM,
                TEX_FORMAT_RGBA8_UNORM_SRGB,
                TEX_FORMAT_RGBA8_SNORM,
                TEX_FORMAT_RG16_FLOAT,
                TEX_FORMAT_RG16_UNORM,
                TEX_FORMAT_RG16_SNORM,
                TEX_FORMAT_R32_FLOAT, // OpenGL ES3.1 does not require this format to be filterable
                TEX_FORMAT_R24_UNORM_X8_TYPELESS,
                TEX_FORMAT_RG8_UNORM,
                TEX_FORMAT_RG8_SNORM,
                TEX_FORMAT_R16_FLOAT,
                TEX_FORMAT_R16_UNORM,
                TEX_FORMAT_R16_SNORM,
                TEX_FORMAT_R8_UNORM,
                TEX_FORMAT_R8_SNORM,
                TEX_FORMAT_A8_UNORM,
                TEX_FORMAT_RGB9E5_SHAREDEXP,
                TEX_FORMAT_RG8_B8G8_UNORM,
                TEX_FORMAT_G8R8_G8B8_UNORM,
                TEX_FORMAT_BC1_UNORM,
                TEX_FORMAT_BC1_UNORM_SRGB,
                TEX_FORMAT_BC2_UNORM,
                TEX_FORMAT_BC2_UNORM_SRGB,
                TEX_FORMAT_BC3_UNORM,
                TEX_FORMAT_BC3_UNORM_SRGB,
                TEX_FORMAT_BC4_UNORM,
                TEX_FORMAT_BC4_SNORM,
                TEX_FORMAT_BC5_UNORM,
                TEX_FORMAT_BC5_SNORM,
                TEX_FORMAT_B5G6R5_UNORM};
        for (Uint32 fmt = 0; fmt < _countof(FilterableFormats); ++fmt)
            m_TextureFormatsInfo[FilterableFormats[fmt]].Filterable = true;
    }